

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EventReportReliablePdu.cpp
# Opt level: O0

int __thiscall DIS::EventReportReliablePdu::getMarshalledSize(EventReportReliablePdu *this)

{
  undefined8 uVar1;
  int iVar2;
  uint uVar3;
  size_type sVar4;
  const_reference pvVar5;
  const_reference pvVar6;
  undefined1 local_78 [8];
  VariableDatum listElement_1;
  unsigned_long_long idx_1;
  undefined1 local_30 [8];
  FixedDatum listElement;
  unsigned_long_long idx;
  int marshalSize;
  EventReportReliablePdu *this_local;
  
  iVar2 = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize
                    (&this->super_SimulationManagementWithReliabilityFamilyPdu);
  idx._4_4_ = iVar2 + 0xe;
  listElement._fixedDatumID = 0;
  listElement._fixedDatumValue = 0;
  while( true ) {
    uVar1 = listElement._8_8_;
    sVar4 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::size
                      (&this->_fixedDatumRecords);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar5 = std::vector<DIS::FixedDatum,_std::allocator<DIS::FixedDatum>_>::operator[]
                       (&this->_fixedDatumRecords,listElement._8_8_);
    FixedDatum::FixedDatum((FixedDatum *)local_30,pvVar5);
    iVar2 = FixedDatum::getMarshalledSize((FixedDatum *)local_30);
    idx._4_4_ = idx._4_4_ + iVar2;
    FixedDatum::~FixedDatum((FixedDatum *)local_30);
    listElement._8_8_ = listElement._8_8_ + 1;
  }
  listElement_1._arrayLength = 0;
  listElement_1._44_4_ = 0;
  while( true ) {
    uVar1 = listElement_1._40_8_;
    sVar4 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::size
                      (&this->_variableDatumRecords);
    if (sVar4 <= (ulong)uVar1) break;
    pvVar6 = std::vector<DIS::VariableDatum,_std::allocator<DIS::VariableDatum>_>::operator[]
                       (&this->_variableDatumRecords,listElement_1._40_8_);
    VariableDatum::VariableDatum((VariableDatum *)local_78,pvVar6);
    uVar3 = VariableDatum::getMarshalledSize((VariableDatum *)local_78);
    idx._4_4_ = idx._4_4_ + uVar3;
    VariableDatum::~VariableDatum((VariableDatum *)local_78);
    listElement_1._40_8_ = listElement_1._40_8_ + 1;
  }
  return idx._4_4_;
}

Assistant:

int EventReportReliablePdu::getMarshalledSize() const
{
   int marshalSize = 0;

   marshalSize = SimulationManagementWithReliabilityFamilyPdu::getMarshalledSize();
   marshalSize = marshalSize + 2;  // _eventType
   marshalSize = marshalSize + 4;  // _pad1
   marshalSize = marshalSize + 4;  // _numberOfFixedDatumRecords
   marshalSize = marshalSize + 4;  // _numberOfVariableDatumRecords

   for(unsigned long long idx=0; idx < _fixedDatumRecords.size(); idx++)
   {
        FixedDatum listElement = _fixedDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }


   for(unsigned long long idx=0; idx < _variableDatumRecords.size(); idx++)
   {
        VariableDatum listElement = _variableDatumRecords[idx];
        marshalSize = marshalSize + listElement.getMarshalledSize();
    }

    return marshalSize;
}